

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O0

bool __thiscall
QPageLayout::setLeftMargin(QPageLayout *this,qreal leftMargin,OutOfBoundsPolicy outOfBoundsPolicy)

{
  long lVar1;
  bool bVar2;
  QPageLayoutPrivate *pQVar3;
  double *pdVar4;
  int in_ESI;
  double in_RDI;
  long in_FS_OFFSET;
  qreal in_XMM0_Qa;
  qreal qVar5;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  double *in_stack_ffffffffffffffa8;
  qreal qVar6;
  double *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc8;
  bool local_21;
  qreal local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x545174);
  local_10 = in_XMM0_Qa;
  if ((pQVar3->m_mode == StandardMode) && (in_ESI == 1)) {
    pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x54518b);
    QMarginsF::left(&pQVar3->m_minMargins);
    pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x5451a7);
    QMarginsF::left(&pQVar3->m_maxMargins);
    pdVar4 = qBound<double>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                            (double *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0))
    ;
    local_10 = *pdVar4;
  }
  pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x5451ed);
  QMarginsF::left(&pQVar3->m_margins);
  bVar2 = qFuzzyCompare((double)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),in_RDI);
  if (bVar2) {
    local_21 = true;
    goto LAB_005452b8;
  }
  pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x545221);
  if (pQVar3->m_mode == FullPageMode) {
LAB_00545286:
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach
              ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x54529a);
    QMarginsF::setLeft(&pQVar3->m_margins,local_10);
    local_21 = true;
  }
  else {
    qVar6 = local_10;
    pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x54523d);
    qVar5 = QMarginsF::left(&pQVar3->m_minMargins);
    if (qVar5 <= qVar6) {
      qVar6 = local_10;
      pQVar3 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x54526e);
      qVar5 = QMarginsF::left(&pQVar3->m_maxMargins);
      if (qVar6 <= qVar5) goto LAB_00545286;
    }
    local_21 = false;
  }
LAB_005452b8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QPageLayout::setLeftMargin(qreal leftMargin, OutOfBoundsPolicy outOfBoundsPolicy)
{
    if (d->m_mode == StandardMode && outOfBoundsPolicy == OutOfBoundsPolicy::Clamp)
        leftMargin = qBound(d->m_minMargins.left(), leftMargin, d->m_maxMargins.left());

    if (qFuzzyCompare(leftMargin, d->m_margins.left()))
        return true;

    if (d->m_mode == FullPageMode
        || (leftMargin >= d->m_minMargins.left() && leftMargin <= d->m_maxMargins.left())) {
        d.detach();
        d->m_margins.setLeft(leftMargin);
        return true;
    }

    return false;
}